

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_routing_linux.c
# Opt level: O0

void os_routing_linux_listener_remove(os_route_listener *listener)

{
  list_entity *plVar1;
  list_entity *plVar2;
  os_route_listener *listener_local;
  
  plVar1 = (listener->_internal)._node.prev;
  plVar2 = (listener->_internal)._node.next;
  plVar1->next = plVar2;
  plVar2->prev = plVar1;
  (listener->_internal)._node.prev = (list_entity *)0x0;
  (listener->_internal)._node.next = (list_entity *)0x0;
  return;
}

Assistant:

void
os_routing_linux_listener_remove(struct os_route_listener *listener) {
  list_remove(&listener->_internal._node);
}